

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O1

bool __thiscall IceCore::Container::Contains(Container *this,udword entry,udword *location)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  uVar1 = this->mCurNbEntries;
  bVar5 = uVar1 != 0;
  if (bVar5) {
    lVar3 = 0;
    if (*this->mEntries != entry) {
      lVar4 = 0;
      do {
        if (uVar1 - 1 == (int)lVar4) {
          return false;
        }
        lVar3 = lVar4 + 1;
        lVar2 = lVar4 + 1;
        lVar4 = lVar3;
      } while (this->mEntries[lVar2] != entry);
      bVar5 = (uint)lVar3 < uVar1;
    }
    if (location != (udword *)0x0) {
      *location = (udword)lVar3;
    }
  }
  return bVar5;
}

Assistant:

bool Container::Contains(udword entry, udword* location) const
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			if(location)	*location = i;
			return true;
		}
	}
	return false;
}